

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp:387:49)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_global_object_cpp:387:49)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  long *plVar2;
  value *a;
  pointer v;
  wchar_t local_30;
  wchar_t local_2c;
  
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (v != pvVar1) {
    do {
      if (v->type_ == string) {
        mjs::operator<<((wostream *)&std::wcout,&(v->field_1).s_);
      }
      else {
        debug_print((wostream *)&std::wcout,v,4,0x7fffffff,0);
      }
      plVar2 = *(long **)(std::use_facet<std::ctype<wchar_t>> + *(long *)(std::wcout + -0x18));
      if (plVar2 == (long *)0x0) goto LAB_0013ea8c;
      local_30 = (**(code **)(*plVar2 + 0x50))(plVar2,0x20);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,&local_30,1);
      v = v + 1;
    } while (v != pvVar1);
  }
  plVar2 = *(long **)(std::use_facet<std::ctype<wchar_t>> + *(long *)(std::wcout + -0x18));
  if (plVar2 != (long *)0x0) {
    local_2c = (**(code **)(*plVar2 + 0x50))(plVar2,10);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)&std::wcout,&local_2c,1);
    value::value(__return_storage_ptr__,(value *)&value::undefined);
    return __return_storage_ptr__;
  }
LAB_0013ea8c:
  std::__throw_bad_cast();
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }